

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O1

bool __thiscall
cmCTestCurl::UploadFile
          (cmCTestCurl *this,string *param_1,string *url,string *fields,string *response)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  bool bVar3;
  unsigned_long uVar4;
  curl_slist *list;
  ostream *poVar5;
  pointer pbVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  string upload_url;
  ostringstream cmCTestLog_msg;
  undefined1 **local_268;
  long local_260;
  undefined1 *local_258;
  undefined1 local_250 [32];
  string *local_230;
  void *local_228;
  void *pvStack_220;
  long local_218;
  FILE *local_210;
  long *local_208;
  long local_1f8 [2];
  void *local_1e8;
  void *pvStack_1e0;
  long local_1d8;
  string local_1c8;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined8 local_190;
  undefined1 *local_188;
  undefined8 local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  response->_M_string_length = 0;
  *(response->_M_dataplus)._M_p = '\0';
  local_230 = response;
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_UPLOAD,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_VERBOSE,1);
    local_210 = (FILE *)cmsys::SystemTools::Fopen(param_1,"rb");
    if (local_210 != (FILE *)0x0) {
      local_1a8._8_8_ = (url->_M_dataplus)._M_p;
      local_1a8._0_8_ = url->_M_string_length;
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_258 = local_250;
      local_268 = (undefined1 **)0x0;
      local_260 = 1;
      local_250[0] = 0x3f;
      local_190 = 1;
      local_180 = 0;
      local_170 = (fields->_M_dataplus)._M_p;
      local_178 = fields->_M_string_length;
      local_168 = 0;
      views._M_len = 3;
      views._M_array = (iterator)local_1a8;
      local_188 = local_258;
      cmCatViews(&local_1c8,views);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_URL,local_1c8._M_dataplus._M_p);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_READDATA,local_210);
      uVar4 = cmsys::SystemTools::FileLength(param_1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_INFILESIZE,uVar4);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                       anon_unknown.dwarf_69e19d::curlWriteMemoryCallback);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                       anon_unknown.dwarf_69e19d::curlDebugCallback);
      list = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
      pbVar6 = (this->HttpHeaders).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->HttpHeaders).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar6 != pbVar1) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"   Add HTTP Header: \"",0x15);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,
                              pbVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar2 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                       ,0x9f,(char *)local_268,this->Quiet);
          if (local_268 != &local_258) {
            operator_delete(local_268,(ulong)(local_258 + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          list = curl_slist_append(list,(pbVar6->_M_dataplus)._M_p);
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != pbVar1);
      }
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,list);
      local_1e8 = (void *)0x0;
      pvStack_1e0 = (void *)0x0;
      local_1d8 = 0;
      local_218 = 0;
      local_228 = (void *)0x0;
      pvStack_220 = (void *)0x0;
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,&local_228);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
      curl_easy_perform((Curl_easy *)this->Curl);
      fclose(local_210);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,0);
      curl_slist_free_all(list);
      if (local_1e8 != pvStack_1e0) {
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)local_1a8);
        std::__cxx11::string::operator=((string *)local_230,(string *)local_1a8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1a8._0_8_ !=
            &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198->_M_dataplus)._M_p + 1))
          ;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Curl response: [",0x10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(local_230->_M_dataplus)._M_p,
                            local_230->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb1,(char *)local_268,this->Quiet);
        if (local_268 != &local_258) {
          operator_delete(local_268,(ulong)(local_258 + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      local_260 = 0;
      local_258 = (undefined1 *)((ulong)local_258 & 0xffffffffffffff00);
      local_268 = &local_258;
      if (local_228 != pvStack_220) {
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)local_1a8);
        std::__cxx11::string::operator=((string *)&local_268,(string *)local_1a8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1a8._0_8_ !=
            &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198->_M_dataplus)._M_p + 1))
          ;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Curl debug: [",0xd)
        ;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_268,local_260);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb7,(char *)local_208,this->Quiet);
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar3 = local_230->_M_string_length != 0;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"No response from server.\n",0x19);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_268,local_260);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xbc,(char *)local_208,false);
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,(ulong)(local_258 + 1));
      }
      if (local_228 != (void *)0x0) {
        operator_delete(local_228,local_218 - (long)local_228);
      }
      if (local_1e8 != (void *)0x0) {
        operator_delete(local_1e8,local_1d8 - (long)local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
        return bVar3;
      }
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      return bVar3;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Could not open file for upload: ",0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(param_1->_M_dataplus)._M_p,param_1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x89,(char *)local_268,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Initialization of curl failed\n",0x1e);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x7e,(char *)local_268,false);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,(ulong)(local_258 + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmCTestCurl::UploadFile(std::string const& local_file,
                             std::string const& url, std::string const& fields,
                             std::string& response)
{
  response.clear();
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed\n");
    return false;
  }
  /* enable uploading */
  curl_easy_setopt(this->Curl, CURLOPT_UPLOAD, 1);

  ::curl_easy_setopt(this->Curl, CURLOPT_VERBOSE, 1);

  FILE* ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
  if (!ftpfile) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not open file for upload: " << local_file << "\n");
    return false;
  }
  // set the url
  std::string upload_url = cmStrCat(url, '?', fields);
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, upload_url.c_str());
  // now specify which file to upload
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILE, ftpfile);
  unsigned long filelen = cmSystemTools::FileLength(local_file);
  // and give the size of the upload (optional)
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILESIZE,
                     static_cast<long>(filelen));
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");
  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);
  // Now run off and do what you've been told!
  ::curl_easy_perform(this->Curl);
  ::fclose(ftpfile);
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, nullptr);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  std::string curlDebug;
  if (!debugData.empty()) {
    curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  if (response.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "No response from server.\n"
                 << curlDebug << std::endl);
    return false;
  }
  return true;
}